

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall
SuiteTimeRangeTests::TestisInSameRange_UseLocalTime::RunImpl(TestisInSameRange_UseLocalTime *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_f0;
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  LocalTimeOnly end;
  LocalTimeOnly start;
  TimeRange timeRange;
  
  FIX::LocalTimeOnly::LocalTimeOnly(&start,0,0,0,0);
  FIX::LocalTimeOnly::LocalTimeOnly(&end,1,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp(&time1,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp(&time2,0xb,0,0,10,10,2000);
  FIX::TimeRange::TimeRange(&timeRange,&start,&end,1,1);
  bVar1 = FIX::TimeRange::isInSameRange(&timeRange,&time1,&time2);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_f0,*ppTVar3,0x104);
    UnitTest::TestResults::OnTestFailure(this_00,&local_f0,"timeRange.isInSameRange(time1, time2)");
  }
  return;
}

Assistant:

TEST(isInSameRange_UseLocalTime)
{
  LocalTimeOnly start( 0, 0, 0 );
  LocalTimeOnly end( 1, 0, 0 );

  UtcTimeStamp time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  TimeRange timeRange(start, end, 1, 1);

  CHECK( timeRange.isInSameRange(time1, time2) );

}